

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

void phyr::stratifiedSample2D(Point2f *sample,int nxSamples,int nySamples,bool jitter,RNG *rng)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Point2f PVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  
  auVar9._0_8_ = (double)nxSamples;
  auVar9._8_8_ = (double)nySamples;
  iVar1 = 0;
  if (nxSamples < 1) {
    nxSamples = 0;
  }
  auVar9 = divpd(_DAT_0010c060,auVar9);
  if (nySamples < 1) {
    nySamples = 0;
  }
  dVar10 = 0.0;
  for (; iVar1 != nySamples; iVar1 = iVar1 + 1) {
    dVar11 = 0.0;
    iVar2 = nxSamples;
    while (dVar5 = 0.5, dVar4 = 0.5, bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      if (jitter) {
        dVar4 = RNG::uniformReal(rng);
        dVar5 = RNG::uniformReal(rng);
      }
      auVar6._0_8_ = (dVar11 + dVar4) * auVar9._0_8_;
      auVar6._8_8_ = (dVar10 + dVar5) * auVar9._8_8_;
      auVar7._8_8_ = 0x3fefffffffffffff;
      auVar7._0_8_ = 0x3fefffffffffffff;
      PVar8 = (Point2f)minpd(auVar7,auVar6);
      *sample = PVar8;
      sample = sample + 1;
      dVar11 = dVar11 + 1.0;
    }
    dVar10 = dVar10 + 1.0;
  }
  return;
}

Assistant:

void stratifiedSample2D(Point2f* sample, int nxSamples, int nySamples, bool jitter, RNG& rng) {
    Real invXSamples = Real(1) / nxSamples, invYSamples = Real(1) / nySamples;
    for (int y = 0; y < nySamples; y++) {
        for (int x = 0; x < nxSamples; x++) {
            Real offX = jitter ? rng.uniformReal() : 0.5;
            Real offY = jitter ? rng.uniformReal() : 0.5;
            sample->x = std::min((x + offX) * invXSamples, OneMinusEpsilon);
            sample->y = std::min((y + offY) * invYSamples, OneMinusEpsilon);
            ++sample;
        }
    }
}